

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O3

ptr<resp_msg> __thiscall
cornerstone::raft_server::handle_prevote_req(raft_server *this,req_msg *req)

{
  undefined4 uVar1;
  undefined4 uVar2;
  element_type *peVar3;
  ulong uVar4;
  bool bVar5;
  undefined8 *puVar6;
  long lVar7;
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  undefined1 auVar9 [16];
  ptr<resp_msg> pVar10;
  long *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  ulong *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  peVar3 = ((req[3].log_entries_.
             super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
           super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar1 = *(undefined4 *)(in_RDX + 0x14);
  puVar6 = (undefined8 *)operator_new(0x40);
  puVar6[1] = 0x100000001;
  *puVar6 = &PTR___Sp_counted_ptr_inplace_00178730;
  uVar2 = *(undefined4 *)((long)&(req->super_msg_base).term_ + 4);
  puVar6[3] = peVar3;
  *(undefined4 *)(puVar6 + 4) = 0x13;
  *(undefined4 *)((long)puVar6 + 0x24) = uVar2;
  *(undefined4 *)(puVar6 + 5) = uVar1;
  puVar6[2] = &PTR__msg_base_00178780;
  puVar6[6] = 0;
  *(undefined1 *)(puVar6 + 7) = 0;
  *(undefined8 **)&this->leader_ = puVar6;
  this->_vptr_raft_server = (_func_int **)(puVar6 + 2);
  uVar4 = *(ulong *)(in_RDX + 0x20);
  (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x20))(&local_40);
  bVar5 = true;
  if (uVar4 <= *local_40) {
    lVar7 = *(long *)(in_RDX + 0x20);
    (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x20))(&local_50);
    if (lVar7 == *local_50) {
      lVar7 = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))();
      bVar5 = lVar7 - 1U <= *(ulong *)(in_RDX + 0x28);
    }
    else {
      bVar5 = false;
    }
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  _Var8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                req[3].log_entries_.
                super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = (bool)(bVar5 & ((__shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2> *)
                         &(_Var8._M_pi)->_vptr__Sp_counted_base)->_M_ptr <=
                         *(element_type **)(in_RDX + 8));
  if (*(char *)((long)((req->log_entries_).
                       super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[7].
                       super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      + 1) + 1) == '\x01') {
    bVar5 = (bool)(bVar5 & req[10].last_log_idx_ != 0);
  }
  if (bVar5) {
    auVar9 = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))();
    _Var8._M_pi = auVar9._8_8_;
    puVar6[6] = auVar9._0_8_;
    *(undefined1 *)(puVar6 + 7) = 1;
  }
  pVar10.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var8._M_pi;
  pVar10.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar10.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr<resp_msg> raft_server::handle_prevote_req(req_msg& req)
{
    ptr<resp_msg> resp(cs_new<resp_msg>(state_->get_term(), msg_type::prevote_response, id_, req.get_src()));
    bool log_okay = req.get_last_log_term() > log_store_->last_entry()->get_term() ||
                    (req.get_last_log_term() == log_store_->last_entry()->get_term() &&
                     log_store_->next_slot() - 1 <= req.get_last_log_idx());
    bool grant = req.get_term() >= state_->get_term() && log_okay;
    if (ctx_->params_->defensive_prevote_)
    {
        // In defensive mode, server will deny the prevote when it's operating well.
        grant = grant && prevote_state_;
    }

    if (grant)
    {
        resp->accept(log_store_->next_slot());
    }

    return resp;
}